

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporary_file_manager.cpp
# Opt level: O2

void __thiscall
duckdb::TemporaryFileManager::TemporaryFileManager
          (TemporaryFileManager *this,DatabaseInstance *db,string *temp_directory_p,
          atomic<unsigned_long> *size_on_disk_p)

{
  this->db = db;
  ::std::__cxx11::string::string((string *)&this->temp_directory,(string *)temp_directory_p);
  *(undefined8 *)((long)&(this->manager_lock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->manager_lock).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->manager_lock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->manager_lock).super___mutex_base._M_mutex + 8) = 0;
  (this->manager_lock).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  TemporaryFileMap::TemporaryFileMap(&this->files,this);
  (this->used_blocks)._M_h._M_buckets = &(this->used_blocks)._M_h._M_single_bucket;
  (this->used_blocks)._M_h._M_bucket_count = 1;
  (this->used_blocks)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->used_blocks)._M_h._M_element_count = 0;
  (this->used_blocks)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->used_blocks)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->used_blocks)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->index_managers)._M_h._M_buckets = &(this->index_managers)._M_h._M_single_bucket;
  (this->index_managers)._M_h._M_bucket_count = 1;
  (this->index_managers)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->index_managers)._M_h._M_element_count = 0;
  (this->index_managers)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->index_managers)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->index_managers)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->size_on_disk = size_on_disk_p;
  this->max_swap_space = 0;
  ::std::array<duckdb::TemporaryFileCompressionAdaptivity,_64UL>::array
            (&this->compression_adaptivities);
  return;
}

Assistant:

TemporaryFileManager::TemporaryFileManager(DatabaseInstance &db, const string &temp_directory_p,
                                           atomic<idx_t> &size_on_disk_p)
    : db(db), temp_directory(temp_directory_p), files(*this), size_on_disk(size_on_disk_p), max_swap_space(0) {
}